

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntMap.h
# Opt level: O1

void __thiscall
Minisat::IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>::insert
          (IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_> *this,int key,lbool val)

{
  vec<Minisat::lbool,_int>::growTo(&this->map,key + 1);
  if (key < (this->map).sz) {
    (this->map).data[key].value = val.value;
    return;
  }
  __assert_fail("has(k)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/luciferxiaozhi[P]VertexCover_CNFSAT_/minisat/minisat/mtl/IntMap.h"
                ,0x28,
                "V &Minisat::IntMap<int, Minisat::lbool>::operator[](K) [K = int, V = Minisat::lbool, MkIndex = Minisat::MkIndexDefault<int>]"
               );
}

Assistant:

void     insert (K key, V val)       { reserve(key); operator[](key) = val; }